

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O2

void dgrminer::print_adjacency_lists
               (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                *adjacency_lists)

{
  ostream *poVar1;
  pointer pAVar2;
  size_t j;
  ulong uVar3;
  size_t j_1;
  long lVar4;
  size_t k;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  pAVar2 = (adjacency_lists->
           super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0;
      uVar8 < (ulong)(((long)(adjacency_lists->
                             super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x48);
      uVar8 = uVar8 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"ADJ NODES: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar5 = 0;
    uVar3 = 0;
    while( true ) {
      pAVar2 = (adjacency_lists->
               super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)&pAVar2[uVar8].nodes.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pAVar2[uVar8].nodes.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl + 8) - lVar4) / 0xc) <= uVar3) break;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar4 + lVar5));
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,*(int *)(*(long *)&(adjacency_lists->
                                                                                                        
                                                  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  nodes.
                                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar5));
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,*(int *)(*(long *)&(adjacency_lists->
                                                                                                        
                                                  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  nodes.
                                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data + 8 + lVar5));
      std::endl<char,std::char_traits<char>>(poVar1);
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 0xc;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"ADJ LIST: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (uVar3 = 0;
        pAVar2 = (adjacency_lists->
                 super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)(((long)*(pointer *)
                                ((long)&pAVar2[uVar8].adjacencyList.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl + 8) -
                        *(long *)&pAVar2[uVar8].adjacencyList.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl) / 0x18); uVar3 = uVar3 + 1) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar1,": ");
      for (uVar6 = 0;
          lVar5 = *(long *)&(adjacency_lists->
                            super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8].adjacencyList.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl, lVar4 = *(long *)(lVar5 + uVar3 * 0x18),
          uVar6 < (ulong)(*(long *)(lVar5 + 8 + uVar3 * 0x18) - lVar4 >> 2); uVar6 = uVar6 + 1) {
        poVar1 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar4 + uVar6 * 4));
        std::operator<<(poVar1," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"MORE INFO LIST: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar3 = 0;
    while( true ) {
      pAVar2 = (adjacency_lists->
               super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pAVar2[uVar8].adjacencyEdgeInfo.
                                  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                  ._M_impl + 8) -
                  *(long *)&pAVar2[uVar8].adjacencyEdgeInfo.
                            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            ._M_impl.super__Vector_impl_data) / 0x18) <= uVar3) break;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar1 = std::operator<<(poVar1,": ");
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar5 = 0;
      for (uVar6 = 0;
          lVar4 = *(long *)&(adjacency_lists->
                            super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8].adjacencyEdgeInfo.
                            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            ._M_impl.super__Vector_impl_data, lVar7 = uVar3 * 0x18,
          uVar6 < (ulong)(*(long *)(lVar4 + 8 + lVar7) - *(long *)(lVar4 + lVar7) >> 5);
          uVar6 = uVar6 + 1) {
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
          poVar1 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              *(int *)(*(long *)(*(long *)&(adjacency_lists->
                                                                                                                      
                                                  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  adjacencyEdgeInfo.
                                                  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar7) + lVar5
                                      + lVar4 * 4));
          std::operator<<(poVar1,", ");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        lVar5 = lVar5 + 0x20;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

void print_adjacency_lists(std::vector<AdjacencyListCrate> adjacency_lists)
	{
		for (size_t i = 0; i < adjacency_lists.size(); i++)
		{

			cout << "ADJ NODES: " << i << endl;
			for (size_t j = 0; j < adjacency_lists[i].nodes.size(); j++) {
				cout << adjacency_lists[i].nodes[j][ADJ_NODES_ID] << ", "
					 << adjacency_lists[i].nodes[j][ADJ_NODES_CHANGETIME] << ", "
					 << adjacency_lists[i].nodes[j][ADJ_NODES_LABEL] << endl;
			}

			cout << "ADJ LIST: " << i << endl;
			// print adj list:
			for (size_t j = 0; j < adjacency_lists[i].adjacencyList.size(); j++)
			{
				cout << j << ": ";
				for (size_t k = 0; k < adjacency_lists[i].adjacencyList[j].size(); k++)
				{
					cout << adjacency_lists[i].adjacencyList[j][k] << " ";
				}
				cout << endl;
			}

			cout << "MORE INFO LIST: " << i << endl;
			// print more info:
			for (size_t j = 0; j < adjacency_lists[i].adjacencyEdgeInfo.size(); j++)
			{
				cout << j << ": " << endl;;
				for (size_t k = 0; k < adjacency_lists[i].adjacencyEdgeInfo[j].size(); k++)
				{
					for (size_t l = 0; l < ADJ_INFO___SIZE; l++)
					{
						cout << adjacency_lists[i].adjacencyEdgeInfo[j][k][l] << ", ";
					}
					cout << endl;

				}
				cout << endl;
			}
		}
	}